

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

bool __thiscall
SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::EditingIterator::Next
          (EditingIterator *this)

{
  SListNodeBase<Memory::Recycler> *pSVar1;
  SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *pSVar2;
  SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *pSVar3;
  code *pcVar4;
  Type TVar5;
  bool bVar6;
  SListNodeBase<Memory::Recycler> *in_RAX;
  NodeBase **ppNVar7;
  undefined4 *puVar8;
  NodeBase **ppNVar9;
  Type local_38;
  
  ppNVar9 = &this->last;
  local_38.ptr = in_RAX;
  if (this->last != (NodeBase *)0x0) {
    pSVar1 = (this->last->next).ptr;
    Memory::Recycler::WBSetBit((char *)&local_38);
    local_38.ptr = pSVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
    if (local_38.ptr != (this->super_Iterator).current) {
      ppNVar7 = ppNVar9;
      ppNVar9 = &(this->super_Iterator).current;
      goto LAB_0097824a;
    }
  }
  ppNVar7 = &(this->super_Iterator).current;
LAB_0097824a:
  *ppNVar9 = *ppNVar7;
  if ((this->super_Iterator).current == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  pSVar2 = (this->super_Iterator).list;
  pSVar3 = (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)
           (((this->super_Iterator).current)->next).ptr;
  Memory::Recycler::WBSetBit((char *)&local_38);
  local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
  TVar5.ptr = local_38.ptr;
  if ((SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)local_38.ptr == pSVar2) {
    (this->super_Iterator).current = (NodeBase *)0x0;
  }
  else {
    pSVar1 = (((this->super_Iterator).current)->next).ptr;
    Memory::Recycler::WBSetBit((char *)&local_38);
    local_38.ptr = pSVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
    (this->super_Iterator).current = local_38.ptr;
  }
  return (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)TVar5.ptr != pSVar2;
}

Assistant:

bool Next()
        {
            if (last != nullptr && last->Next() != this->current)
            {
                this->current = last;
            }
            else
            {
                last = this->current;
            }
            return Iterator::Next();
        }